

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
calculator::AssignVariableException::~AssignVariableException(AssignVariableException *this)

{
  AssignVariableException *this_local;
  
  ~AssignVariableException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

AssignVariableException(const std::string& variable) {
        error_msg =
            "Error: declare variabe [" + variable + "] must be separated by ;";
    }